

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_edge_lock.hpp
# Opt level: O2

pair<double,_double> __thiscall
ear::ScreenEdgeLockHandler::handleAzimuthElevation
          (ScreenEdgeLockHandler *this,double azimuth,double elevation,
          ScreenEdgeLock *screenEdgeLock)

{
  not_implemented *this_00;
  pair<double,_double> pVar1;
  allocator<char> local_39;
  string local_38;
  
  if (((screenEdgeLock->horizontal).super_type.m_initialized == false) &&
     ((screenEdgeLock->vertical).super_type.m_initialized != true)) {
    pVar1.second = elevation;
    pVar1.first = azimuth;
    return pVar1;
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"screenEdgeLock",&local_39)
  ;
  not_implemented::not_implemented(this_00,&local_38);
  __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<double, double> handleAzimuthElevation(
        double azimuth, double elevation, ScreenEdgeLock screenEdgeLock) {
      if (screenEdgeLock.horizontal || screenEdgeLock.vertical)
        throw not_implemented("screenEdgeLock");

      return std::make_pair(azimuth, elevation);
    }